

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O0

void __thiscall MultiANN::UpdateAnnArray(MultiANN *this)

{
  uint uVar1;
  void *pvVar2;
  ANN *in_RDI;
  __type _Var3;
  bool done;
  int n_last;
  int n;
  int num;
  int k;
  int j;
  undefined8 in_stack_ffffffffffffff68;
  int __y;
  double in_stack_ffffffffffffff70;
  ANN *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffffa8;
  int size;
  void *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  int iVar4;
  int *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  int iVar5;
  int in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  
  size = in_RDI->numPoints;
  iVar5 = 0;
  if (0 < size) {
    __y = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    iVar4 = size;
    _Var3 = std::pow<double,int>(in_stack_ffffffffffffff70,__y);
    if (iVar4 % (int)_Var3 == 0) {
      for (local_18 = 0x1e; 3 < local_18; local_18 = local_18 + -1) {
        if ((&in_RDI->epsilon)[local_18] != 0.0) {
          iVar5 = ANN::LastNode((ANN *)(&in_RDI->epsilon)[local_18]);
        }
      }
      iVar5 = iVar5 + 1;
      if (iVar5 != in_RDI->numPoints) {
        local_18 = 3;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 & 0xffffff;
        while( true ) {
          uVar1 = in_stack_ffffffffffffffb8 & 0xffffff;
          if (local_18 < 0x1f) {
            uVar1 = CONCAT13((char)(in_stack_ffffffffffffffd8 >> 0x18),
                             (int3)in_stack_ffffffffffffffb8) ^ 0xff000000;
          }
          in_stack_ffffffffffffffb8 = uVar1;
          if ((in_stack_ffffffffffffffb8 & 0x1000000) == 0) break;
          local_18 = local_18 + 1;
          if ((&in_RDI->epsilon)[local_18] == 0.0) {
            in_stack_ffffffffffffffd8 = CONCAT13(1,(int3)in_stack_ffffffffffffffd8);
          }
          else {
            in_stack_ffffffffffffffb0 = (void *)(&in_RDI->epsilon)[local_18];
            if (in_stack_ffffffffffffffb0 != (void *)0x0) {
              ANN::~ANN(in_stack_ffffffffffffff90);
              operator_delete(in_stack_ffffffffffffffb0);
            }
            (&in_RDI->epsilon)[local_18] = 0.0;
          }
        }
        _Var3 = std::pow<double,int>(in_stack_ffffffffffffff70,__y);
        if (size == (int)_Var3) {
          in_stack_ffffffffffffffe0 = 0;
        }
        else {
          local_14 = local_18;
          in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 & 0xffffff;
          while( true ) {
            uVar1 = in_stack_ffffffffffffffa8 & 0xffffff;
            if (local_14 < 0x1f) {
              uVar1 = CONCAT13((char)(in_stack_ffffffffffffffd8 >> 0x18),
                               (int3)in_stack_ffffffffffffffa8) ^ 0xff000000;
            }
            in_stack_ffffffffffffffa8 = uVar1;
            if ((in_stack_ffffffffffffffa8 & 0x1000000) == 0) break;
            if ((&in_RDI->epsilon)[local_14] != 0.0) {
              in_stack_ffffffffffffffe0 = ANN::LastNode((ANN *)(&in_RDI->epsilon)[local_14]);
              in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1;
              in_stack_ffffffffffffffd8 = CONCAT13(1,(int3)in_stack_ffffffffffffffd8);
            }
            local_14 = local_14 + 1;
          }
        }
        if ((in_stack_ffffffffffffffd8 & 0x1000000) == 0) {
          in_stack_ffffffffffffffe0 = 0;
        }
        pvVar2 = operator_new(0x40);
        std::pow<double,int>(in_stack_ffffffffffffff70,__y);
        ANN::ANN(in_RDI,(ANNpointArray)CONCAT44(iVar4,in_stack_ffffffffffffffb8),
                 (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,size
                 ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffd0,
                 (ANNpoint)CONCAT44(iVar5,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffe0);
        (&in_RDI->epsilon)[local_18] = (double)pvVar2;
      }
    }
  }
  return;
}

Assistant:

void MultiANN::UpdateAnnArray()  // updates the arrays of data points
{
    int j, k, num;
    int n, n_last;
    bool done;

    num = size;
    n_last = 0;  // Just to make warnings go away

    if ((num > 0) && (num % ((int)pow((double)2, ANN_STARTING_INDEX)) ==
                      0)) {  // Check if it is time to update the ANNs

        for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX; k--) {
            if (AnnArray[k])
                n_last = AnnArray[k]->LastNode();  // Make sure update has not
                                                   // been performed
        }
        n_last++;

        if (n_last != size) {  // If equal, then update already performed

            k = ANN_STARTING_INDEX - 1;
            done = false;
            while ((k <= ANN_MAXIMUM_INDEX) && (!done)) {
                k++;
                if (!AnnArray[k]) {  // If there is no tree, then make one
                    done = true;
                } else {
                    delete (AnnArray[k]);  // Blow this one away; these nodes
                                           // are moved up
                    AnnArray[k] = NULL;
                }
            }

            if ((num == ((int)pow((double)2, ANN_STARTING_INDEX))))  // k should
                                                                     // be the
                                                                     // location
                                                                     // for
                                                                     // making
                                                                     // the new
                                                                     // ANN tree
                n = 0;  // Need to find the starting node in G for the new ANN
                        // tree
            else {
                j = k;
                done = false;
                while ((j <= ANN_MAXIMUM_INDEX) && (!done)) {
                    if (AnnArray[j]) {
                        n = AnnArray[j]->LastNode();
                        n++;
                        done = true;
                    }
                    j++;
                }
            }

            if (!done) n = 0;

            AnnArray[k] =
                new ANN(points_coor, n, size, (int)pow((double)2, k), dimension,
                        topology, scaling,
                        NumNeighbors);  // Finally, make the new ANN tree

            // cout << "New ANN Tree:  k: " << k << " num: " << num << "\n";
            // for (j = ANN_MAXIMUM_INDEX; j >= ANN_STARTING_INDEX; j--) {
            // 	cout << (AnnArray[j] ? "X" : ".");
            //}
            // cout << "\n";
        }
    }
}